

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_details.cxx
# Opt level: O3

void __thiscall xray_re::xr_level_details::~xr_level_details(xr_level_details *this)

{
  pointer ppxVar1;
  pointer ppxVar2;
  
  this->_vptr_xr_level_details = (_func_int **)&PTR__xr_level_details_00249a70;
  if (this->m_slots != (detail_slot_v3 *)0x0) {
    operator_delete__(this->m_slots);
  }
  ppxVar1 = (this->m_models).super__Vector_base<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppxVar2 = (this->m_models).
                 super__Vector_base<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppxVar2 != ppxVar1; ppxVar2 = ppxVar2 + 1) {
    if (*ppxVar2 != (xr_dm *)0x0) {
      (*((*ppxVar2)->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[1])();
    }
  }
  if (this->m_texture != (xr_image *)0x0) {
    (*this->m_texture->_vptr_xr_image[1])();
  }
  if (this->m_raw_texture != (uint8_t *)0x0) {
    operator_delete__(this->m_raw_texture);
  }
  ppxVar2 = (this->m_models).super__Vector_base<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppxVar2 != (pointer)0x0) {
    operator_delete(ppxVar2,(long)(this->m_models).
                                  super__Vector_base<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppxVar2
                   );
    return;
  }
  return;
}

Assistant:

xr_level_details::~xr_level_details()
{
	delete[] m_slots;
	delete_elements(m_models);
	delete m_texture;
	delete[] m_raw_texture;
}